

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O2

string_view __thiscall absl::ByString::Find(ByString *this,string_view text,size_t pos)

{
  size_type __n;
  string_view sVar1;
  undefined1 auVar2 [16];
  size_type sVar3;
  size_type sVar4;
  char *pcVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  string_view sVar7;
  string_view text_local;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  pcVar5 = text._M_str;
  sVar3 = text._M_len;
  __n = (this->delimiter_)._M_string_length;
  text_local._M_len = sVar3;
  text_local._M_str = pcVar5;
  if (__n == 1) {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      (&text_local,*(this->delimiter_)._M_dataplus._M_p,pos);
    if (sVar3 != 0xffffffffffffffff) {
      bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&text_local,sVar3,1);
      sVar7._M_len = bVar6._M_len;
      sVar7._M_str = bVar6._M_str;
      return sVar7;
    }
    pcVar5 = text_local._M_str + text_local._M_len;
  }
  else {
    if (sVar3 == 0 || __n != 0) {
      local_28._M_len = sVar3;
      local_28._M_str = pcVar5;
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        (&local_28,(this->delimiter_)._M_dataplus._M_p,pos,__n);
      if (sVar4 == 0xffffffffffffffff) {
        sVar4 = sVar3;
        __n = 0;
      }
      sVar1._M_str = pcVar5 + sVar4;
      sVar1._M_len = __n;
      return sVar1;
    }
    pcVar5 = pcVar5 + pos + 1;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = pcVar5;
  return (string_view)(auVar2 << 0x40);
}

Assistant:

absl::string_view ByString::Find(absl::string_view text, size_t pos) const {
  if (delimiter_.length() == 1) {
    // Much faster to call find on a single character than on an
    // absl::string_view.
    size_t found_pos = text.find(delimiter_[0], pos);
    if (found_pos == absl::string_view::npos)
      return absl::string_view(text.data() + text.size(), 0);
    return text.substr(found_pos, 1);
  }
  return GenericFind(text, delimiter_, pos, LiteralPolicy());
}